

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int nni_tcp_dialer_alloc(nng_stream_dialer **dp,nng_url *url)

{
  char *__s;
  int iVar1;
  nng_stream_dialer *arg;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  arg = (nng_stream_dialer *)nni_zalloc(0x5d0);
  if (arg == (nng_stream_dialer *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_mtx_init((nni_mtx *)&arg[0x16].sd_close);
    nni_aio_list_init((nni_list *)&arg[0x15].sd_get_tls);
    nni_aio_init((nni_aio *)&arg[7].sd_get,tcp_dial_res_cb,arg);
    nni_aio_init((nni_aio *)&arg[0xe].sd_set,tcp_dial_con_cb,arg);
    iVar1 = nni_tcp_dialer_init((nni_tcp_dialer **)&arg[7].sd_dial);
    if (iVar1 == 0) {
      arg->sd_close = tcp_dialer_close;
      arg->sd_free = tcp_dialer_free;
      arg->sd_stop = tcp_dialer_stop;
      arg->sd_dial = tcp_dialer_dial;
      arg->sd_get = tcp_dialer_get;
      arg->sd_set = tcp_dialer_set;
      if (url->u_port != 0) {
        __s = url->u_hostname;
        sVar2 = strlen(__s);
        if (0xffffffffffffff00 < sVar2 - 0x100) {
          pcVar4 = url->u_scheme;
          pcVar3 = strchr(pcVar4,0x34);
          if (pcVar3 == (char *)0x0) {
            pcVar4 = strchr(pcVar4,0x36);
            if (pcVar4 == (char *)0x0) {
              *(undefined4 *)((long)&arg[5].sd_free + 4) = 0;
            }
            else {
              *(undefined4 *)((long)&arg[5].sd_free + 4) = 4;
            }
          }
          else {
            *(undefined4 *)((long)&arg[5].sd_free + 4) = 3;
          }
          snprintf((char *)(arg + 1),0x100,"%s",__s);
          *(short *)&arg[5].sd_free = (short)url->u_port;
          *dp = arg;
          return 0;
        }
      }
      tcp_dialer_free(arg);
      iVar1 = 0xf;
    }
    else {
      tcp_dialer_free(arg);
    }
  }
  return iVar1;
}

Assistant:

int
nni_tcp_dialer_alloc(nng_stream_dialer **dp, const nng_url *url)
{
	tcp_dialer *d;
	int         rv;

	if ((rv = tcp_dialer_alloc(&d)) != 0) {
		return (rv);
	}

	if ((url->u_port == 0) || strlen(url->u_hostname) == 0 ||
	    strlen(url->u_hostname) >= sizeof(d->host)) {
		// Dialer needs both a destination hostname and port.
		tcp_dialer_free(d);
		return (NNG_EADDRINVAL);
	}

	if (strchr(url->u_scheme, '4') != NULL) {
		d->af = NNG_AF_INET;
	} else if (strchr(url->u_scheme, '6') != NULL) {
		d->af = NNG_AF_INET6;
	} else {
		d->af = NNG_AF_UNSPEC;
	}

	snprintf(d->host, sizeof(d->host), "%s", url->u_hostname);
	d->port = url->u_port;

	*dp = (void *) d;
	return (0);
}